

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this)

{
  uint __tmp;
  undefined8 uVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  uVar1 = CONCAT44(VVar2.field_0.i32_,VVar2.field_0.i32_);
  VVar2.field_0._8_8_ = uVar1;
  VVar2.field_0.i64_ = uVar1;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}